

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O0

DArray<int> *
Kernel::PrecedenceOrdering::predLevelsFromOptsAndPrec
          (Problem *prb,Options *opt,DArray<int> *predicatePrecedences)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  LiteralComparisonMode LVar4;
  uint uVar5;
  PredicateSineLevels PVar6;
  int *piVar7;
  Symbol *this;
  DArray<int> *in_RCX;
  Options *in_RDX;
  DArray<int> *in_RDI;
  Symbol *predSym;
  uint i_2;
  uint level;
  uint i_1;
  bool reverse;
  uint bound;
  uint i;
  uint nPredicates;
  DArray<int> *predicateLevels;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 local_9c;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_38;
  
  uVar3 = Signature::predicates((Signature *)0x8b6437);
  Lib::DArray<int>::DArray
            ((DArray<int> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             (size_t)in_stack_ffffffffffffff28);
  LVar4 = Shell::Options::literalComparisonMode(in_RDX);
  if (LVar4 < STANDARD) {
    for (local_38 = 1; local_38 < uVar3; local_38 = local_38 + 1) {
      piVar7 = Lib::DArray<int>::operator[](in_RCX,(ulong)local_38);
      iVar1 = *piVar7;
      piVar7 = Lib::DArray<int>::operator[](in_RDI,(ulong)local_38);
      *piVar7 = iVar1 + 1;
    }
  }
  else if (LVar4 == STANDARD) {
    Lib::DArray<int>::init(in_RDI,(EVP_PKEY_CTX *)(ulong)uVar3);
  }
  piVar7 = Lib::DArray<int>::operator[](in_RDI,0);
  *piVar7 = 0;
  if (DAT_01333850 != 0) {
    uVar5 = (uint)DAT_01333848;
    PVar6 = Shell::Options::sineToPredLevels(in_RDX);
    for (local_44 = 1; local_44 < uVar3; local_44 = local_44 + 1) {
      bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                        (in_stack_ffffffffffffff28,
                         (uint *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (uint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (!bVar2) {
        local_48 = uVar5;
      }
      if (PVar6 == ON) {
        local_9c = uVar5 - local_48;
      }
      else {
        local_9c = local_48;
      }
      piVar7 = Lib::DArray<int>::operator[](in_RDI,(ulong)local_44);
      *piVar7 = local_9c + 1;
    }
  }
  for (local_4c = 1; local_4c < uVar3; local_4c = local_4c + 1) {
    this = Signature::getPredicate
                     ((Signature *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff1c);
    bVar2 = Signature::Symbol::label(this);
    if (bVar2) {
      piVar7 = Lib::DArray<int>::operator[](in_RDI,(ulong)local_4c);
      *piVar7 = -1;
    }
    else {
      bVar2 = Signature::Symbol::equalityProxy(this);
      if (bVar2) {
        in_stack_ffffffffffffff24 = uVar3 + 2;
        piVar7 = Lib::DArray<int>::operator[](in_RDI,(ulong)local_4c);
        *piVar7 = in_stack_ffffffffffffff24;
      }
    }
  }
  checkLevelAssumptions(in_RDI);
  return in_RDI;
}

Assistant:

DArray<int> PrecedenceOrdering::predLevelsFromOptsAndPrec(Problem& prb, const Options& opt, const DArray<int>& predicatePrecedences) {
  unsigned nPredicates = env.signature->predicates();

  DArray<int> predicateLevels(nPredicates);

  switch(opt.literalComparisonMode()) {
  case Shell::Options::LiteralComparisonMode::STANDARD:
    predicateLevels.init(nPredicates, PredLevels::MIN_USER_DEF);
    break;
  case Shell::Options::LiteralComparisonMode::PREDICATE:
  case Shell::Options::LiteralComparisonMode::REVERSE:
    for(unsigned i=1;i<nPredicates;i++) {
      predicateLevels[i] = predicatePrecedences[i] + PredLevels::MIN_USER_DEF;
    }
    break;
  }
  //equality is on the lowest level
  predicateLevels[0] = PredLevels::EQ;

  if (env.predicateSineLevels) {
    // predicateSineLevels start from zero
    unsigned bound = env.maxSineLevel; // this is at least as large as the maximal value of a predicateSineLevel
    bool reverse = (opt.sineToPredLevels() == Options::PredicateSineLevels::ON); // the ON, i.e. reasonable, version wants low sine levels mapping to high predicateLevels

    for(unsigned i=1;i<nPredicates;i++) { // starting from 1, keeping predicateLevels[0]=0;
      unsigned level;
      if (!env.predicateSineLevels->find(i,level)) {
        level = bound;
      }
      predicateLevels[i] = (reverse ? (bound - level) : level) + PredLevels::MIN_USER_DEF;
      // cout << "setting predicate level of " << env.signature->predicateName(i) << " to " << predicateLevels[i] << endl;
    }
  }

  for(unsigned i=1;i<nPredicates;i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    //consequence-finding name predicates have the lowest level
    if(predSym->label()) {
      predicateLevels[i]=-1;
    }
    else if(predSym->equalityProxy()) {
      //equality proxy predicates have the highest level (lower than colored predicates)
      predicateLevels[i] = nPredicates + PredLevels::MIN_USER_DEF+ 1;
    }
  }

  checkLevelAssumptions(predicateLevels);
  return predicateLevels;
}